

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

char * flatcc_builder_extend_string(flatcc_builder_t *B,size_t len)

{
  uint uVar1;
  __flatcc_builder_frame_t *p_Var2;
  int iVar3;
  uint uVar4;
  
  p_Var2 = B->frame;
  if (p_Var2->type != 6) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x3d2,"char *flatcc_builder_extend_string(flatcc_builder_t *, size_t)");
  }
  uVar1 = (p_Var2->container).table.pl_end;
  uVar4 = (uint)len;
  if (!CARRY4(uVar1,uVar4)) {
    (p_Var2->container).table.pl_end = uVar1 + uVar4;
    uVar1 = B->ds_offset;
    uVar4 = uVar4 + uVar1;
    B->ds_offset = uVar4;
    if ((B->ds_limit <= uVar4) && (iVar3 = reserve_ds(B,(ulong)(uVar4 + 1),0xfffffffc), iVar3 != 0))
    {
      return (char *)0x0;
    }
    return (char *)(B->ds + uVar1);
  }
  __assert_fail("n <= n1 && n1 <= max_count",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x391,
                "int vector_count_add(flatcc_builder_t *, flatbuffers_uoffset_t, flatbuffers_uoffset_t)"
               );
}

Assistant:

char *flatcc_builder_extend_string(flatcc_builder_t *B, size_t len)
{
    check(frame(type) == flatcc_builder_string, "expected string frame");
    if (vector_count_add(B, (uoffset_t)len, max_string_len)) {
        return 0;
    }
    return push_ds(B, (uoffset_t)len);
}